

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong global_00;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT ntet;
  REF_INT nnode;
  REF_INT face_id;
  REF_INT new_node;
  REF_DBL xyz [3];
  REF_GLOB global;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  char command [1024];
  char filename [1024];
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  REF_CELL local_8f0;
  REF_INT local_8e8;
  int local_8e4;
  undefined1 local_8e0 [4];
  uint local_8dc;
  REF_DBL local_8d8;
  REF_DBL local_8d0;
  REF_DBL local_8c8;
  ulong local_8c0;
  undefined1 local_8b4 [4];
  undefined1 local_8b0 [4];
  undefined1 local_8ac [4];
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  char local_838 [1024];
  char local_438 [1032];
  
  pRVar2 = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)pRVar2->n,(ulong)(uint)ref_grid->cell[3]->n)
  ;
  snprintf(local_438,0x400,"%s-aflr-surface.lb8.ugrid",project);
  uVar4 = ref_export_by_extension(ref_grid,local_438);
  if (uVar4 == 0) {
    if (options == (char *)0x0) {
      pcVar9 = 
      "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid -mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 < /dev/null > %s-aflr.txt"
      ;
      options = project;
    }
    else {
      pcVar9 = 
      "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid %s < /dev/null > %s-aflr.txt"
      ;
    }
    snprintf(local_838,0x400,pcVar9,project,project,options);
    puts(local_838);
    fflush(_stdout);
    iVar5 = system(local_838);
    if (iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x98e,
             "ref_geom_aflr_volume","aflr failed",0,(long)iVar5);
      return 1;
    }
    RVar1 = pRVar2->n;
    snprintf(local_438,0x400,"%s-aflr-volume.ugrid",project);
    ref_node = ref_grid->node;
    __stream = fopen(local_438,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",local_438);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x932,
             "ref_import_ugrid_tets","unable to open file");
      uVar4 = 2;
    }
    else {
      iVar5 = __isoc99_fscanf(__stream,"%d",&local_8f4);
      if (iVar5 == 1) {
        iVar5 = __isoc99_fscanf(__stream,"%d",&local_8fc);
        if (iVar5 == 1) {
          iVar5 = __isoc99_fscanf(__stream,"%d",&local_900);
          if (iVar5 == 1) {
            iVar5 = __isoc99_fscanf(__stream,"%d",&local_8f8);
            if (iVar5 == 1) {
              iVar5 = __isoc99_fscanf(__stream,"%d",local_8ac);
              if (iVar5 == 1) {
                iVar5 = __isoc99_fscanf(__stream,"%d",local_8b0);
                if (iVar5 == 1) {
                  iVar5 = __isoc99_fscanf(__stream,"%d",local_8b4);
                  if (iVar5 == 1) {
                    local_8e8 = RVar1;
                    if (0 < local_8f4) {
                      local_8f0 = (REF_CELL)(long)ref_node->n;
                      global_00 = 0;
LAB_0018bf54:
                      iVar5 = __isoc99_fscanf(__stream,"%lf",&local_8d8);
                      if (iVar5 == 1) {
                        iVar5 = __isoc99_fscanf(__stream,"%lf",&local_8d0);
                        if (iVar5 != 1) {
                          local_8c0 = (ulong)iVar5;
                          pcVar9 = "y";
                          global_00 = 1;
                          uVar8 = 0x940;
                          goto LAB_0018c4f7;
                        }
                        iVar5 = __isoc99_fscanf(__stream,"%lf",&local_8c8);
                        if (iVar5 != 1) {
                          local_8c0 = (ulong)iVar5;
                          pcVar9 = "z";
                          global_00 = 1;
                          uVar8 = 0x941;
                          goto LAB_0018c4f7;
                        }
                        if ((long)global_00 < (long)local_8f0) {
LAB_0018c026:
                          global_00 = global_00 + 1;
                          if ((long)local_8f4 <= (long)global_00) goto LAB_0018c03e;
                          goto LAB_0018bf54;
                        }
                        uVar4 = ref_node_next_global(ref_node,(REF_GLOB *)&local_8c0);
                        if (uVar4 != 0) {
                          pcVar9 = "next global";
                          uVar8 = 0x943;
                          goto LAB_0018c4be;
                        }
                        if (global_00 != local_8c0) {
                          pcVar9 = "global node index";
                          uVar8 = 0x944;
                          goto LAB_0018c4f7;
                        }
                        uVar4 = ref_node_add(ref_node,global_00,(REF_INT *)&local_8dc);
                        if (uVar4 != 0) {
                          pcVar9 = "new_node";
                          uVar8 = 0x945;
                          goto LAB_0018c4be;
                        }
                        if (global_00 == local_8dc) {
                          pRVar3 = ref_node->real;
                          lVar7 = (long)(int)(local_8dc * 0xf);
                          pRVar3[lVar7] = local_8d8;
                          pRVar3[lVar7 + 1] = local_8d0;
                          pRVar3[lVar7 + 2] = local_8c8;
                          goto LAB_0018c026;
                        }
                        local_8c0 = (ulong)(int)local_8dc;
                        pcVar9 = "node index";
                        uVar8 = 0x946;
                      }
                      else {
                        local_8c0 = (ulong)iVar5;
                        pcVar9 = "x";
                        global_00 = 1;
                        uVar8 = 0x93f;
                      }
LAB_0018c4f7:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,uVar8,"ref_import_ugrid_tets",pcVar9,global_00,local_8c0);
                      goto LAB_0018c3c0;
                    }
LAB_0018c03e:
                    if (0 < local_8fc) {
                      iVar5 = 0;
                      do {
                        lVar7 = 0;
                        do {
                          iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
                          if (iVar6 != 1) {
                            pcVar9 = "tri";
                            uVar8 = 0x94f;
                            goto LAB_0018c3b9;
                          }
                          lVar7 = lVar7 + 4;
                        } while (lVar7 != 0xc);
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_8fc);
                    }
                    if (0 < local_900) {
                      iVar5 = 0;
                      do {
                        lVar7 = 0;
                        do {
                          iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
                          if (iVar6 != 1) {
                            pcVar9 = "qua";
                            uVar8 = 0x953;
                            goto LAB_0018c3b9;
                          }
                          lVar7 = lVar7 + 4;
                        } while (lVar7 != 0x10);
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_900);
                    }
                    if (0 < local_8fc) {
                      iVar5 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",local_8e0);
                        if (iVar6 != 1) {
                          pcVar9 = "tri id";
                          uVar8 = 0x957;
                          goto LAB_0018c3b9;
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_8fc);
                    }
                    if (0 < local_900) {
                      iVar5 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",local_8e0);
                        if (iVar6 != 1) {
                          pcVar9 = "qua id";
                          uVar8 = 0x95b;
                          goto LAB_0018c3b9;
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_900);
                    }
                    if (local_8f8 < 1) {
LAB_0018c1c5:
                      fclose(__stream);
                      printf("%d interior nodes\n",(ulong)(uint)(pRVar2->n - local_8e8));
                      ref_grid->surf = 0;
                      return 0;
                    }
                    local_8f0 = ref_grid->cell[8];
                    iVar5 = 0;
LAB_0018c156:
                    lVar7 = 0;
                    do {
                      iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
                      if (iVar6 != 1) {
                        pcVar9 = "tet";
                        uVar8 = 0x961;
                        goto LAB_0018c3b9;
                      }
                      lVar7 = lVar7 + 4;
                    } while (lVar7 != 0x10);
                    local_8a8 = local_8a8 + -1;
                    iStack_8a4 = iStack_8a4 + -1;
                    iStack_8a0 = iStack_8a0 + -1;
                    iStack_89c = iStack_89c + -1;
                    uVar4 = ref_cell_add(local_8f0,&local_8a8,&local_8e4);
                    if (uVar4 != 0) {
                      pcVar9 = "new tet";
                      uVar8 = 0x966;
LAB_0018c4be:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                             ,uVar8,"ref_import_ugrid_tets",(ulong)uVar4,pcVar9);
                      goto LAB_0018c3c5;
                    }
                    if (iVar5 == local_8e4) goto code_r0x0018c1bb;
                    pcVar9 = "tet index";
                    uVar8 = 0x967;
                    goto LAB_0018c3b9;
                  }
                  pcVar9 = "nhex";
                  uVar8 = 0x93a;
                }
                else {
                  pcVar9 = "npri";
                  uVar8 = 0x939;
                }
              }
              else {
                pcVar9 = "npyr";
                uVar8 = 0x938;
              }
            }
            else {
              pcVar9 = "ntet";
              uVar8 = 0x937;
            }
          }
          else {
            pcVar9 = "nqua";
            uVar8 = 0x936;
          }
        }
        else {
          pcVar9 = "ntri";
          uVar8 = 0x935;
        }
      }
      else {
        pcVar9 = "nnode";
        uVar8 = 0x934;
      }
LAB_0018c3b9:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
             "ref_import_ugrid_tets",pcVar9);
LAB_0018c3c0:
      uVar4 = 1;
    }
LAB_0018c3c5:
    pcVar9 = "tets only";
    uVar8 = 0x993;
  }
  else {
    pcVar9 = "ugrid";
    uVar8 = 0x97b;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_aflr_volume",(ulong)uVar4,pcVar9);
  return uVar4;
code_r0x0018c1bb:
  iVar5 = iVar5 + 1;
  if (local_8f8 <= iVar5) goto LAB_0018c1c5;
  goto LAB_0018c156;
}

Assistant:

REF_FCN REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid, const char *project,
                                        const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  char filename[1024];
  char command[1024];
  int system_status;
  REF_INT nnode_surface;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 1024, "%s-aflr-surface.lb8.ugrid", project);
  RSS(ref_export_by_extension(ref_grid, filename), "ugrid");
  if (NULL == options) {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "-mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 "
        "< /dev/null > %s-aflr.txt",
        project, project, project);
  } else {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "%s "
        "< /dev/null > %s-aflr.txt",
        project, project, options, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  system_status = system(command);
  REIS(0, system_status, "aflr failed");

  nnode_surface = ref_node_n(ref_node);

  snprintf(filename, 1024, "%s-aflr-volume.ugrid", project);
  RSS(ref_import_ugrid_tets(ref_grid, filename), "tets only");

  printf("%d interior nodes\n", ref_node_n(ref_node) - nnode_surface);

  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}